

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O3

ssize_t __thiscall
wasm::WasmBinaryReader::read(WasmBinaryReader *this,int __fd,void *__buf,size_t __nbytes)

{
  ulong uVar1;
  unsigned_long __val;
  bool bVar2;
  uint32_t __val_00;
  uint32_t uVar3;
  ssize_t extraout_RAX;
  long *plVar4;
  size_type *psVar5;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<unsigned_char,_true,_false>,_bool> pVar6;
  string_view sVar7;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  byte local_31 [8];
  uint8_t sectionCode;
  
  if ((this->DWARF == true) && (bVar2 = hasDWARFSections(this), !bVar2)) {
    this->DWARF = false;
  }
  if (this->debugInfo == true) {
    findAndReadNames(this);
  }
  readHeader(this);
  SourceMapReader::parse(&this->sourceMapReader,this->wasm);
  if (this->pos <
      (ulong)((long)(this->input->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->input->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start)) {
    do {
      local_31[0] = getInt8(this);
      __val_00 = getU32LEB(this);
      __val = this->pos;
      uVar1 = __val + __val_00;
      if ((ulong)((long)(this->input->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->input->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                       super__Vector_impl_data._M_start) < uVar1) {
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1b8,"Section extends beyond end of input","");
        throwError(this,&local_1b8);
      }
      if (local_31[0] == 0) {
switchD_00c657ee_caseD_0:
        readCustomSection(this,(ulong)__val_00);
        if (uVar1 < this->pos) {
          std::__cxx11::to_string(&local_118,__val);
          std::operator+(&local_f8,"bad user section size, started at ",&local_118);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_f8);
          local_78._M_dataplus._M_p = (pointer)*plVar4;
          psVar5 = (size_type *)(plVar4 + 2);
          if ((size_type *)local_78._M_dataplus._M_p == psVar5) {
            local_78.field_2._M_allocated_capacity = *psVar5;
            local_78.field_2._8_8_ = plVar4[3];
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          }
          else {
            local_78.field_2._M_allocated_capacity = *psVar5;
          }
          local_78._M_string_length = plVar4[1];
          *plVar4 = (long)psVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::__cxx11::to_string(&local_d8,__val_00);
          std::operator+(&local_98,&local_78,&local_d8);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
          local_58._M_dataplus._M_p = (pointer)*plVar4;
          psVar5 = (size_type *)(plVar4 + 2);
          if ((size_type *)local_58._M_dataplus._M_p == psVar5) {
            local_58.field_2._M_allocated_capacity = *psVar5;
            local_58.field_2._8_8_ = plVar4[3];
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          }
          else {
            local_58.field_2._M_allocated_capacity = *psVar5;
          }
          local_58._M_string_length = plVar4[1];
          *plVar4 = (long)psVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::__cxx11::to_string(&local_b8,this->pos);
          std::operator+(&local_178,&local_58,&local_b8);
          throwError(this,&local_178);
        }
        this->pos = uVar1;
      }
      else {
        local_58._M_dataplus._M_p = (pointer)&this->seenSections;
        pVar6 = std::
                _Hashtable<unsigned_char,unsigned_char,std::allocator<unsigned_char>,std::__detail::_Identity,std::equal_to<unsigned_char>,std::hash<unsigned_char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                ::
                _M_insert<unsigned_char_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_char,false>>>>
                          ((_Hashtable<unsigned_char,unsigned_char,std::allocator<unsigned_char>,std::__detail::_Identity,std::equal_to<unsigned_char>,std::hash<unsigned_char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                            *)&this->seenSections,local_31,&local_58);
        if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          std::__cxx11::to_string(&local_58,(uint)local_31[0]);
          std::operator+(&local_198,"section seen more than once: ",&local_58);
          throwError(this,&local_198);
        }
        switch(local_31[0]) {
        case 0:
          goto switchD_00c657ee_caseD_0;
        case 1:
          readTypes(this);
          break;
        case 2:
          readImports(this);
          break;
        case 3:
          readFunctionSignatures(this);
          break;
        case 4:
          readTableDeclarations(this);
          break;
        case 5:
          readMemories(this);
          break;
        case 6:
          readGlobals(this);
          break;
        case 7:
          readExports(this);
          break;
        case 8:
          uVar3 = getU32LEB(this);
          this->startIndex = uVar3;
          sVar7 = (string_view)getFunctionName(this,uVar3);
          (this->wasm->start).super_IString.str = sVar7;
          break;
        case 9:
          readElementSegments(this);
          break;
        case 10:
          if (this->DWARF == true) {
            this->codeSectionLocation = this->pos;
          }
          readFunctions(this);
          break;
        case 0xb:
          readDataSegments(this);
          break;
        case 0xc:
          this->hasDataCount = true;
          uVar3 = getU32LEB(this);
          this->dataCount = (ulong)uVar3;
          createDataSegments(this,uVar3);
          break;
        case 0xd:
          readTags(this);
          break;
        case 0xe:
          readStrings(this);
          break;
        default:
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,"unrecognized section ID: ","");
          std::__cxx11::to_string(&local_98,(uint)local_31[0]);
          std::operator+(&local_158,&local_58,&local_98);
          throwError(this,&local_158);
        }
      }
      if (this->pos != uVar1) {
        std::__cxx11::to_string(&local_118,__val);
        std::operator+(&local_f8,"bad section size, started at ",&local_118);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_f8);
        local_78._M_dataplus._M_p = (pointer)*plVar4;
        psVar5 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_78._M_dataplus._M_p == psVar5) {
          local_78.field_2._M_allocated_capacity = *psVar5;
          local_78.field_2._8_8_ = plVar4[3];
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        }
        else {
          local_78.field_2._M_allocated_capacity = *psVar5;
        }
        local_78._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::to_string(&local_d8,__val_00);
        std::operator+(&local_98,&local_78,&local_d8);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_98);
        local_58._M_dataplus._M_p = (pointer)*plVar4;
        psVar5 = (size_type *)(plVar4 + 2);
        if ((size_type *)local_58._M_dataplus._M_p == psVar5) {
          local_58.field_2._M_allocated_capacity = *psVar5;
          local_58.field_2._8_8_ = plVar4[3];
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        }
        else {
          local_58.field_2._M_allocated_capacity = *psVar5;
        }
        local_58._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::to_string(&local_b8,this->pos);
        std::operator+(&local_138,&local_58,&local_b8);
        throwError(this,&local_138);
      }
    } while (uVar1 < (ulong)((long)(this->input->super__Vector_base<char,_std::allocator<char>_>).
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->input->super__Vector_base<char,_std::allocator<char>_>).
                                  _M_impl.super__Vector_impl_data._M_start));
  }
  validateBinary(this);
  return extraout_RAX;
}

Assistant:

void WasmBinaryReader::read() {
  if (DWARF) {
    // In order to update dwarf, we must store info about each IR node's
    // binary position. This has noticeable memory overhead, so we don't do it
    // by default: the user must request it by setting "DWARF", and even if so
    // we scan ahead to see that there actually *are* DWARF sections, so that
    // we don't do unnecessary work.
    if (!hasDWARFSections()) {
      DWARF = false;
    }
  }

  // Skip ahead and read the name section so we know what names to use when we
  // construct module elements.
  if (debugInfo) {
    findAndReadNames();
  }

  readHeader();
  sourceMapReader.parse(wasm);

  // Read sections until the end
  while (more()) {
    uint8_t sectionCode = getInt8();
    uint32_t payloadLen = getU32LEB();
    if (uint64_t(pos) + uint64_t(payloadLen) > input.size()) {
      throwError("Section extends beyond end of input");
    }

    auto oldPos = pos;

    // Note the section in the list of seen sections, as almost no sections can
    // appear more than once, and verify those that shouldn't do not.
    if (sectionCode != BinaryConsts::Section::Custom &&
        !seenSections.insert(sectionCode).second) {
      throwError("section seen more than once: " + std::to_string(sectionCode));
    }

    switch (sectionCode) {
      case BinaryConsts::Section::Start:
        readStart();
        break;
      case BinaryConsts::Section::Memory:
        readMemories();
        break;
      case BinaryConsts::Section::Type:
        readTypes();
        break;
      case BinaryConsts::Section::Import:
        readImports();
        break;
      case BinaryConsts::Section::Function:
        readFunctionSignatures();
        break;
      case BinaryConsts::Section::Code:
        if (DWARF) {
          codeSectionLocation = pos;
        }
        readFunctions();
        break;
      case BinaryConsts::Section::Export:
        readExports();
        break;
      case BinaryConsts::Section::Element:
        readElementSegments();
        break;
      case BinaryConsts::Section::Strings:
        readStrings();
        break;
      case BinaryConsts::Section::Global:
        readGlobals();
        break;
      case BinaryConsts::Section::Data:
        readDataSegments();
        break;
      case BinaryConsts::Section::DataCount:
        readDataSegmentCount();
        break;
      case BinaryConsts::Section::Table:
        readTableDeclarations();
        break;
      case BinaryConsts::Section::Tag:
        readTags();
        break;
      case BinaryConsts::Section::Custom: {
        readCustomSection(payloadLen);
        if (pos > oldPos + payloadLen) {
          throwError("bad user section size, started at " +
                     std::to_string(oldPos) + " plus payload " +
                     std::to_string(payloadLen) +
                     " not being equal to new position " + std::to_string(pos));
        }
        pos = oldPos + payloadLen;
        break;
      }
      default:
        throwError(std::string("unrecognized section ID: ") +
                   std::to_string(sectionCode));
    }

    // make sure we advanced exactly past this section
    if (pos != oldPos + payloadLen) {
      throwError("bad section size, started at " + std::to_string(oldPos) +
                 " plus payload " + std::to_string(payloadLen) +
                 " not being equal to new position " + std::to_string(pos));
    }
  }

  validateBinary();
}